

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::SonarQubeReporter::writeTestCase(SonarQubeReporter *this,TestCaseNode *testCaseNode)

{
  SectionNode *sectionNode;
  allocator<char> local_41;
  string local_40;
  
  sectionNode = ((testCaseNode->children).
                 super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  writeSection(this,&local_40,sectionNode,
               (((testCaseNode->value).testInfo)->properties & (MayFail|ShouldFail)) != None);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void SonarQubeReporter::writeTestCase(TestCaseNode const& testCaseNode) {
        // All test cases have exactly one section - which represents the
        // test case itself. That section may have 0-n nested sections
        assert(testCaseNode.children.size() == 1);
        SectionNode const& rootSection = *testCaseNode.children.front();
        writeSection("", rootSection, testCaseNode.value.testInfo->okToFail());
    }